

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

ReadWriter_ptr __thiscall XipFile::getrvareader(XipFile *this,uint32_t rva,uint32_t size)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var2;
  OffsetReader *this_01;
  RangeReader *__p;
  uint in_ECX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long lVar3;
  ulong size_00;
  bool bVar4;
  ReadWriter_ptr RVar5;
  ReadWriter_ptr local_38;
  
  lVar3 = CONCAT44(in_register_00000034,rva);
  this_01 = (OffsetReader *)operator_new(0x30);
  local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(lVar3 + 8);
  local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x10);
  if (local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  size_00 = (ulong)in_ECX;
  OffsetReader::OffsetReader(this_01,&local_38,(ulong)(size - *(int *)(lVar3 + 0xa0)),size_00);
  (this->super_FileContainer)._vptr_FileContainer = (_func_int **)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<OffsetReader*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->_r,this_01);
  if (local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  __p = (RangeReader *)operator_new(0x40);
  peVar1 = (element_type *)(this->super_FileContainer)._vptr_FileContainer;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__p->super_ReadWriter)._readonly = false;
    (__p->super_ReadWriter)._vptr_ReadWriter = (_func_int **)&PTR__RangeReader_00145bf0;
    (__p->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__p->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      bVar4 = __libc_single_threaded == '\0';
      (__p->super_ReadWriter)._readonly = false;
      (__p->super_ReadWriter)._vptr_ReadWriter = (_func_int **)&PTR__RangeReader_00145bf0;
      (__p->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (__p->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_00;
      if (bVar4) {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_0011e1a1;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      (__p->super_ReadWriter)._readonly = false;
      (__p->super_ReadWriter)._vptr_ReadWriter = (_func_int **)&PTR__RangeReader_00145bf0;
      (__p->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      (__p->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_00;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_0011e1a1:
  __p->_startofs = 0;
  __p->_endofs = size_00;
  __p->_size = size_00;
  __p->_curpos = 0;
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::reset<RangeReader>
            ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)this,__p);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pp_Var2 = (this->super_FileContainer)._vptr_FileContainer;
  (**(code **)(*pp_Var2 + 0x20))(pp_Var2,0);
  RVar5.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar5.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ReadWriter_ptr)RVar5.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ReadWriter_ptr getrvareader(uint32_t rva, uint32_t size)
    {
        ReadWriter_ptr r(new OffsetReader(_r, rva-_hdr.rvabase, size));
        r.reset(new RangeReader(r, 0, size));
        r->setpos(0);
        return r;
    }